

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::
     PostWalker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
     ::operator()(SegmentReferrerCollector *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_SegmentReferrerCollector_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00756143:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_00755d78:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00756143;
    }
    local_38 = pEVar1 + 2;
    local_40 = operator();
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_PostWalker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    ).
                    super_Walker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_00755bc1;
  case LoopId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00756143;
    }
    goto LAB_0075569c;
  case BreakId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00756143;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = operator();
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_PostWalker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    ).
                    super_Walker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00755500;
  case SwitchId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x007554fa;
  case CallId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00756143;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00756143;
    }
    break;
  case LocalSetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00756143;
    }
    goto LAB_00755cb3;
  case GlobalGetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00756143;
    }
    break;
  case GlobalSetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00756143;
    }
    goto LAB_0075569c;
  case LoadId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00756143;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00755cc1;
  case StoreId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00756143;
    }
    goto LAB_00755960;
  case ConstId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00756143;
    }
    break;
  case UnaryId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00756143;
    }
    goto LAB_00755cb3;
  case BinaryId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00756143;
    }
    goto LAB_007558f7;
  case SelectId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00756143;
    }
    goto LAB_00755bb2;
  case DropId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case ReturnId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00756143;
    }
    goto LAB_007554f1;
  case MemorySizeId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00756143;
    }
    break;
  case MemoryGrowId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case NopId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00756143;
    }
    break;
  case UnreachableId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00756143;
    }
    break;
  case AtomicRMWId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00756143;
    }
    goto LAB_007559e3;
  case AtomicCmpxchgId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00756143;
    }
    goto LAB_007559d4;
  case AtomicWaitId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00756143;
    }
    goto LAB_007556bd;
  case AtomicNotifyId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00756143;
    }
    goto LAB_007558f7;
  case AtomicFenceId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00756143;
    }
    break;
  case SIMDExtractId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00756143;
    }
    goto LAB_00755cb3;
  case SIMDReplaceId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00756143;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_00755902;
  case SIMDShuffleId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00756143;
    }
    goto LAB_00755bc1;
  case SIMDTernaryId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00756143;
    }
    goto LAB_007556bd;
  case SIMDShiftId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00756143;
    }
    goto LAB_007558f7;
  case SIMDLoadId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00756143;
    }
    goto LAB_0075587c;
  case SIMDLoadStoreLaneId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00756143;
    }
LAB_00755960:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00755cc1;
  case MemoryInitId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00756143;
    }
    goto LAB_007559d4;
  case DataDropId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00756143;
    }
    break;
  case MemoryCopyId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00756143;
    }
    goto LAB_00755bb2;
  case MemoryFillId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00756143;
    }
    goto LAB_00755bb2;
  case PopId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00756143;
    }
    break;
  case RefNullId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00756143;
    }
    break;
  case RefIsNullId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case RefFuncId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00756143;
    }
    break;
  case RefEqId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00756143;
    }
    goto LAB_00755bc1;
  case TableGetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00756143;
    }
    goto LAB_0075569c;
  case TableSetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00756143;
    }
    goto LAB_007559e3;
  case TableSizeId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00756143;
    }
    break;
  case TableGrowId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00756143;
    }
    goto LAB_007559e3;
  case TableFillId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_00756143;
    }
    goto LAB_007559d4;
  case TableCopyId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_00756143;
    }
    goto LAB_00755bb2;
  case TableInitId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_00756143;
    }
    goto LAB_007559d4;
  case TryId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00756143;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_0075569c:
    pEVar1 = pEVar1 + 2;
    goto LAB_00755cc1;
  case TryTableId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case ThrowId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00756143;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00756143;
    }
    break;
  case ThrowRefId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case TupleMakeId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00756143;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case RefI31Id:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case I31GetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case CallRefId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case RefCastId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case BrOnId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00756143;
    }
LAB_0075587c:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00755cc1;
  case StructNewId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00756143;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00756143;
    }
    goto LAB_00755cb3;
  case StructSetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00756143;
    }
    goto LAB_007558f7;
  case StructRMWId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_00756143;
    }
    goto LAB_007558f7;
  case StructCmpxchgId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_00756143;
    }
LAB_007556bd:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_00755902;
  case ArrayNewId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[1].type);
LAB_007554f1:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x007554fa:
    if (lVar5 != 0) {
LAB_00755500:
      local_40 = operator();
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_PostWalker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    ).
                    super_Walker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    .stack,&local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_00756143;
    }
    goto LAB_007559e3;
  case ArrayNewElemId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_00756143;
    }
    goto LAB_007559e3;
  case ArrayNewFixedId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00756143;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00756143;
    }
    goto LAB_00755bc1;
  case ArraySetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00756143;
    }
    goto LAB_00755bb2;
  case ArrayLenId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00756143;
    }
    goto LAB_00755758;
  case ArrayCopyId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 3));
    goto LAB_00755ba3;
  case ArrayFillId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00756143;
    }
LAB_00755ba3:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[2].type);
    goto LAB_00755bb2;
  case ArrayInitDataId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_00756143;
    }
    goto LAB_00754fe8;
  case ArrayInitElemId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_00756143;
    }
LAB_00754fe8:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[3].type);
LAB_007559d4:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 3));
LAB_007559e3:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00755cc1;
  case RefAsId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00756143;
    }
    goto LAB_00755cb3;
  case StringNewId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00756143;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = operator();
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_PostWalker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    ).
                    super_Walker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    .stack,&local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = operator();
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_PostWalker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    ).
                    super_Walker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_00755cb3;
  case StringConstId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00756143;
    }
    break;
  case StringMeasureId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00756143;
    }
LAB_00755cb3:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00755cc1;
  case StringEncodeId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00756143;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = operator();
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>::Task,10ul>
      ::operator()(&(self->
                    super_PostWalker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    ).
                    super_Walker<SegmentReferrerCollector,_wasm::UnifiedExpressionVisitor<SegmentReferrerCollector,_void>_>
                    .stack,&local_40,(Expression ***)&local_38);
    }
    goto LAB_007558f7;
  case StringConcatId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00756143;
    }
    goto LAB_00755bc1;
  case StringEqId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00756143;
    }
LAB_007558f7:
    currp_00 = pEVar1 + 2;
LAB_00755902:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00755cc1;
  case StringWTF16GetId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00756143;
    }
    goto LAB_00755bc1;
  case StringSliceWTFId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00756143;
    }
LAB_00755bb2:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 2));
LAB_00755bc1:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00755cc1;
  case ContNewId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_00756143;
    }
LAB_00755758:
    pEVar1 = pEVar1 + 1;
LAB_00755cc1:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)pEVar1);
    return;
  case ContBindId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case SuspendId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_00756143;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[5].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 5) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ResumeThrowId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[6].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 6) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StackSwitchId:
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
                      ::operator(),currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_00756143;
    }
    Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
    ::operator()(self,operator(),(Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_00755d78;
        Walker<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,wasm::UnifiedExpressionVisitor<wasm::ModuleSplitting::(anonymous_namespace)::ModuleSplitter::classifyFunctions(wasm::Module&,wasm::ModuleSplitting::Config_const&)::$_0::TEMPNAMEPLACEHOLDERVALUE(wasm::Function*,std::vector<wasm::Name,std::allocator<wasm::Name>>&)const::SegmentReferrerCollector,void>>
        ::operator()(self,operator(),(Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }